

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

natwm_error workspace_add_client(natwm_state *state,workspace *workspace,client *client)

{
  workspace_list *pwVar1;
  natwm_error nVar2;
  node *pnVar3;
  
  pwVar1 = state->workspace_list;
  natwm_state_lock(state);
  pnVar3 = list_insert(workspace->clients,client);
  if (pnVar3 == (node *)0x0) {
    nVar2 = MEMORY_ALLOCATION_ERROR;
  }
  else {
    map_insert(pwVar1->client_map,client,&workspace->index);
    if (workspace->active_client != (client *)0x0) {
      client_set_unfocused(state,workspace->active_client);
    }
    workspace->active_client = client;
    nVar2 = NO_ERROR;
  }
  natwm_state_unlock(state);
  return nVar2;
}

Assistant:

enum natwm_error workspace_add_client(struct natwm_state *state, struct workspace *workspace,
                                      struct client *client)
{
        struct workspace_list *list = state->workspace_list;

        // We will be modifying the state - need to lock until done
        natwm_state_lock(state);

        if (list_insert(workspace->clients, client) == NULL) {
                natwm_state_unlock(state);

                return MEMORY_ALLOCATION_ERROR;
        }

        // Cache which workspace this client is currenty active on
        map_insert(list->client_map, &client->window, &workspace->index);

        // Update active_client
        if (workspace->active_client) {
                client_set_unfocused(state, workspace->active_client);
        }

        workspace->active_client = client;

        natwm_state_unlock(state);

        return NO_ERROR;
}